

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O3

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
::updateIntercept(GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
                  *this,Array<Array4<Real>,_3> *inter_arr,Array<Array4<const_Type_t>,_3> *type_arr,
                 Array4<const_double> *lst,Geometry *geom)

{
  Array4<double> *pAVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  uint *puVar21;
  double *pdVar22;
  long lVar23;
  int idim;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  Array4<const_unsigned_int> *pAVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  bool bVar42;
  double dVar43;
  long local_a0;
  
  dVar2 = (geom->super_CoordSys).dx[0];
  dVar3 = (geom->super_CoordSys).dx[1];
  dVar4 = (geom->super_CoordSys).dx[2];
  dVar5 = (geom->prob_domain).xlo[0];
  dVar6 = (geom->prob_domain).xlo[1];
  dVar7 = (geom->prob_domain).xlo[2];
  lVar24 = 0;
  do {
    iVar10 = inter_arr->_M_elems[lVar24].begin.z;
    iVar11 = inter_arr->_M_elems[lVar24].end.z;
    if (iVar10 < iVar11) {
      pAVar1 = inter_arr->_M_elems + lVar24;
      pAVar30 = type_arr->_M_elems + lVar24;
      iVar12 = (pAVar1->end).y;
      iVar13 = (pAVar1->end).x;
      iVar14 = (pAVar1->begin).y;
      iVar15 = (pAVar1->begin).x;
      lVar25 = (long)iVar15;
      local_a0 = (long)iVar10;
      do {
        if (iVar14 < iVar12) {
          dVar38 = (double)(int)local_a0 * dVar4 + dVar7;
          dVar39 = (double)(int)(local_a0 + 1) * dVar4 + dVar7;
          lVar26 = (long)iVar14;
          do {
            if (iVar15 < iVar13) {
              iVar16 = (pAVar30->begin).y;
              iVar17 = (pAVar30->begin).z;
              lVar33 = (long)(lst->begin).y;
              lVar36 = (long)(lst->begin).z;
              lVar19 = pAVar30->jstride;
              lVar20 = pAVar30->kstride;
              iVar18 = (pAVar30->begin).x;
              puVar21 = pAVar30->p;
              lVar37 = lst->jstride * 8;
              lVar27 = (lVar26 - lVar33) * lVar37;
              lVar31 = lst->kstride * 8;
              lVar34 = (local_a0 - lVar36) * lVar31;
              lVar28 = (long)(lst->begin).x;
              dVar40 = (double)(int)lVar26 * dVar3 + dVar6;
              dVar41 = (double)(int)(lVar26 + 1) * dVar3 + dVar6;
              pdVar22 = lst->p;
              lVar23 = lVar27 + lVar34 + lVar28 * -8 + lVar25 * 8;
              lVar35 = 0;
              do {
                if (puVar21[lVar25 + (((lVar26 - iVar16) * lVar19 +
                                      (local_a0 - iVar17) * lVar20 + lVar35) - (long)iVar18)] == 2)
                {
                  lVar29 = pAVar1->jstride * (lVar26 - iVar14) * 8 +
                           pAVar1->kstride * (local_a0 - iVar10) * 8;
                  dVar8 = *(double *)((long)pAVar1->p + lVar35 * 8 + lVar29);
                  if ((int)lVar24 == 1) {
                    dVar9 = *(double *)((long)pdVar22 + lVar35 * 8 + lVar23);
                    dVar43 = dVar40;
                    if (((dVar9 != 0.0) || (NAN(dVar9))) && (dVar9 <= 0.0 || !NAN(dVar8))) {
                      dVar9 = *(double *)
                               ((long)pdVar22 +
                               lVar35 * 8 +
                               lVar37 * ((lVar26 + 1) - lVar33) + lVar34 + lVar28 * -8 + lVar25 * 8)
                      ;
                      dVar43 = dVar41;
                      if ((dVar9 != 0.0) || (NAN(dVar9))) {
                        bVar42 = !NAN(dVar8) || dVar9 <= 0.0;
LAB_0031fcc4:
                        if (bVar42) goto LAB_0031fce9;
                      }
                    }
                  }
                  else if ((int)lVar24 == 0) {
                    dVar9 = *(double *)((long)pdVar22 + lVar35 * 8 + lVar23);
                    if (((dVar9 == 0.0) && (!NAN(dVar9))) || (0.0 < dVar9 && NAN(dVar8))) {
                      iVar32 = iVar15 + (int)lVar35;
                    }
                    else {
                      dVar9 = *(double *)((long)pdVar22 + lVar35 * 8 + lVar23 + 8);
                      if (((dVar9 != 0.0) || (NAN(dVar9))) && (!NAN(dVar8) || dVar9 <= 0.0))
                      goto LAB_0031fce9;
                      iVar32 = iVar15 + (int)lVar35 + 1;
                    }
                    dVar43 = (double)iVar32 * dVar2 + dVar5;
                  }
                  else {
                    dVar9 = *(double *)((long)pdVar22 + lVar35 * 8 + lVar23);
                    dVar43 = dVar38;
                    if (((dVar9 != 0.0) || (NAN(dVar9))) && (dVar9 <= 0.0 || !NAN(dVar8))) {
                      dVar9 = *(double *)
                               ((long)pdVar22 +
                               lVar35 * 8 +
                               lVar31 * ((local_a0 + 1) - lVar36) + lVar27 + lVar28 * -8 +
                               lVar25 * 8);
                      dVar43 = dVar39;
                      if ((dVar9 != 0.0) || (NAN(dVar9))) {
                        bVar42 = !NAN(dVar8) || dVar9 <= 0.0;
                        goto LAB_0031fcc4;
                      }
                    }
                  }
                  *(double *)((long)pAVar1->p + lVar35 * 8 + lVar29) = dVar43;
                }
LAB_0031fce9:
                lVar35 = lVar35 + 1;
              } while (iVar13 - lVar25 != lVar35);
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != iVar12);
        }
        local_a0 = local_a0 + 1;
      } while (local_a0 != iVar11);
    }
    lVar24 = lVar24 + 1;
    if (lVar24 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                          Array<Array4<Type_t const>,AMREX_SPACEDIM> const& type_arr,
                          Array4<Real const> const& lst, Geometry const& geom) const noexcept
    {
        auto const& dx = geom.CellSizeArray();
        auto const& problo = geom.ProbLoArray();
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            Array4<Real> const& inter = inter_arr[idim];
            Array4<Type_t const> const& type = type_arr[idim];
            const Box bx{inter};
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                if (type(i,j,k) == Type::irregular) {
                    bool is_nan = amrex::isnan(inter(i,j,k));
                    if (idim == 0) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            // interp might still be quiet_nan because lst that
                            // was set to zero has been changed by FillBoundary
                            // at periodic bounadries.
                            inter(i,j,k) = problo[0] + i*dx[0];
                        }
                        else if (lst(i+1,j,k) == Real(0.0) ||
                                 (lst(i+1,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[0] + (i+1)*dx[0];
                        }
                    } else if (idim == 1) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + j*dx[1];
                        }
                        else if (lst(i,j+1,k) == Real(0.0) ||
                                 (lst(i,j+1,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + (j+1)*dx[1];
                        }
                    } else {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + k*dx[2];
                        }
                        else if (lst(i,j,k+1) == Real(0.0) ||
                                 (lst(i,j,k+1) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + (k+1)*dx[2];
                        }
                    }
                }
            });
        }
    }